

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo_approach.cpp
# Opt level: O0

line_bound * find_longest_line(line_bound *__return_storage_ptr__,Mat *img)

{
  int iVar1;
  uchar *puVar2;
  ulong local_40;
  size_t i;
  size_t iend;
  uint8_t *arr;
  size_t current;
  size_t ibegin;
  size_t max;
  Mat *img_local;
  
  memset(__return_storage_ptr__,0,0x18);
  current = 0;
  arr = (uint8_t *)0x0;
  puVar2 = cv::Mat::ptr<unsigned_char>(img,0,0);
  iVar1 = *(int *)(img + 0xc);
  for (local_40 = 0; local_40 < (ulong)(long)iVar1; local_40 = local_40 + 1) {
    if (puVar2[local_40] == '\0') {
      if ((uint8_t *)__return_storage_ptr__->size < arr) {
        __return_storage_ptr__->size = (size_t)arr;
        __return_storage_ptr__->ibegin = current;
        __return_storage_ptr__->iend = local_40;
      }
      arr = (uint8_t *)0x0;
      current = 0;
    }
    else {
      if (arr == (uint8_t *)0x0) {
        current = local_40;
      }
      arr = arr + 1;
    }
  }
  if ((uint8_t *)__return_storage_ptr__->size < arr) {
    __return_storage_ptr__->size = (size_t)arr;
    __return_storage_ptr__->ibegin = current;
    __return_storage_ptr__->iend = (long)iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

line_bound find_longest_line(const cv::Mat& img)
{
    line_bound result {0, 0, 0};
    std::size_t max = 0;

    std::size_t ibegin = 0;
    std::size_t current = 0;

    const uint8_t* arr = img.ptr<uint8_t>(0, 0);
    std::size_t iend = img.cols;
    for(std::size_t i = 0; i < iend; i++)
    {
        if(arr[i] > 0)
        {
            if(current == 0)
            {
                ibegin = i;
                current++;
            }
            else
            {
                current++;
            }
        }
        else
        {
            if(current > result.size)
            {
                result.size = current;
                result.ibegin = ibegin;
                result.iend = i;
            }
            current = 0;
            ibegin = 0;
        }
    }
    if(current > result.size)
    {
        result.size = current;
        result.ibegin = ibegin;
        result.iend = iend;
    }

    return result;
}